

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInCountByHandle(void *handle,void *tx_data_handle,uint32_t *count)

{
  ConfidentialTransaction *this;
  uint32_t uVar1;
  CfdException *this_00;
  bool is_bitcoin;
  allocator local_49;
  string local_48;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_48,"TransactionData",(allocator *)&is_bitcoin);
  cfd::capi::CheckBuffer(tx_data_handle,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this == (ConfidentialTransaction *)0x0) {
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_48,"Invalid handle state. tx is null",&local_49);
    cfd::core::CfdException::CfdException(this_00,kCfdIllegalStateError,&local_48);
    __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin == true) {
    if (count == (uint32_t *)0x0) {
      return 0;
    }
    uVar1 = cfd::core::Transaction::GetTxInCount((Transaction *)this);
  }
  else {
    if (count == (uint32_t *)0x0) {
      return 0;
    }
    uVar1 = cfd::core::ConfidentialTransaction::GetTxInCount(this);
  }
  *count = uVar1;
  return 0;
}

Assistant:

int CfdGetTxInCountByHandle(
    void* handle, void* tx_data_handle, uint32_t* count) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (count != nullptr) *count = tx->GetTxInCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (count != nullptr) *count = tx->GetTxInCount();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}